

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::updateLayoutDirection(QMenuPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QMenuPrivate *in_RDI;
  LayoutDirection unaff_retaddr;
  QWidget *w_1;
  QWidget *w;
  QMenu *q;
  undefined8 in_stack_ffffffffffffffe0;
  WidgetAttribute attribute;
  QWidget *in_stack_ffffffffffffffe8;
  
  attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  q_func(in_RDI);
  bVar1 = QWidget::testAttribute(in_stack_ffffffffffffffe8,attribute);
  if (!bVar1) {
    pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x642f93);
    if (pQVar2 == (QWidget *)0x0) {
      pQVar2 = QWidget::parentWidget((QWidget *)0x642fc1);
      if (pQVar2 == (QWidget *)0x0) {
        QGuiApplication::layoutDirection();
        QWidgetPrivate::setLayoutDirection_helper((QWidgetPrivate *)w_1,unaff_retaddr);
      }
      else {
        QWidget::layoutDirection((QWidget *)0x642fd8);
        QWidgetPrivate::setLayoutDirection_helper((QWidgetPrivate *)w_1,unaff_retaddr);
      }
    }
    else {
      QWidget::layoutDirection((QWidget *)0x642faa);
      QWidgetPrivate::setLayoutDirection_helper((QWidgetPrivate *)w_1,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void QMenuPrivate::updateLayoutDirection()
{
    Q_Q(QMenu);
    //we need to mimic the cause of the popup's layout direction
    //to allow setting it on a mainwindow for example
    //we call setLayoutDirection_helper to not overwrite a user-defined value
    if (!q->testAttribute(Qt::WA_SetLayoutDirection)) {
        if (QWidget *w = causedPopup.widget)
            setLayoutDirection_helper(w->layoutDirection());
        else if (QWidget *w = q->parentWidget())
            setLayoutDirection_helper(w->layoutDirection());
        else
            setLayoutDirection_helper(QGuiApplication::layoutDirection());
    }
}